

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

int uv_kill(int pid,int signum)

{
  int iVar1;
  int *piVar2;
  int signum_local;
  int pid_local;
  
  iVar1 = kill(pid,signum);
  if (iVar1 == 0) {
    signum_local = 0;
  }
  else {
    piVar2 = __errno_location();
    signum_local = -*piVar2;
  }
  return signum_local;
}

Assistant:

int uv_kill(int pid, int signum) {
  if (kill(pid, signum)) {
#if defined(__MVS__)
    /* EPERM is returned if the process is a zombie. */
    siginfo_t infop;
    if (errno == EPERM &&
        waitid(P_PID, pid, &infop, WNOHANG | WNOWAIT | WEXITED) == 0)
      return 0;
#endif
    return UV__ERR(errno);
  } else
    return 0;
}